

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O3

int TestReintersectConvex(ShapeHandle *shape,RNG *rng)

{
  uint64_t uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  ShapeHandle *pSVar10;
  bool bVar11;
  uint uVar12;
  uint64_t oldstate;
  float *pfVar13;
  ulong uVar14;
  Tuple3<pbrt::Point3,_float> *pTVar15;
  byte bVar16;
  int c;
  int iVar17;
  int iVar18;
  Sphere *this;
  Curve *this_00;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar25 [16];
  double dVar22;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar34 [64];
  undefined1 in_XMM7 [16];
  Bounds3f bbox;
  optional<pbrt::ShapeIntersection> si;
  Tuple3<pbrt::Point3,_float> local_348;
  DispatchSplit<6> local_339;
  int local_338;
  undefined4 local_334;
  ShapeHandle *local_330;
  float local_328 [4];
  float local_318;
  float local_314;
  Tuple3<pbrt::Vector3,_float> local_310;
  Bounds3f local_300;
  undefined1 local_2e8 [16];
  Ray local_2d0;
  Ray local_2a8;
  undefined1 local_278 [16];
  float local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined1 local_258 [16];
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_248;
  char local_148;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_138;
  byte local_38;
  undefined1 extraout_var [60];
  
  iVar17 = 0;
  local_314 = 0.0;
  local_318 = 0.0;
  local_328[3] = 0.0;
  local_330 = shape;
  do {
    uVar14 = rng->state;
    rng->state = uVar14 * 0x5851f42d4c957f2d + rng->inc;
    uVar12 = (uint)(uVar14 >> 0x2d) ^ (uint)(uVar14 >> 0x1b);
    bVar16 = (byte)(uVar14 >> 0x3b);
    auVar24 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,uVar12 >> bVar16 | uVar12 << 0x20 - bVar16);
    auVar24 = vminss_avx(ZEXT416((uint)(auVar24._0_4_ * 2.3283064e-10)),
                         SUB6416(ZEXT464(0x3f7fffff),0));
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(auVar24._0_4_ * 8.0)),
                              ZEXT416((uint)(1.0 - auVar24._0_4_)),ZEXT416(0xc1000000));
    dVar22 = pow(10.0,(double)auVar24._0_4_);
    auVar24 = in_ZMM3._0_16_;
    pfVar13 = (float *)((long)local_328 + 0x14);
    if ((iVar17 != 0) && (pfVar13 = (float *)((long)local_328 + 0xc), iVar17 == 1)) {
      pfVar13 = (float *)((long)local_328 + 0x10);
    }
    iVar17 = iVar17 + 1;
    *pfVar13 = (float)dVar22;
  } while (iVar17 != 3);
  uVar14 = (local_330->
           super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
           ).bits;
  uVar12 = (uint)(ushort)(uVar14 >> 0x30);
  if (uVar14 >> 0x32 == 0) {
    this = (Sphere *)(uVar14 & 0xffffffffffff);
    if (uVar14 >> 0x31 == 0) {
      pbrt::Sphere::Bounds(&local_300,this);
    }
    else if (uVar12 == 2) {
      pbrt::Cylinder::Bounds(&local_300,(Cylinder *)this);
    }
    else {
      pbrt::Disk::Bounds(&local_300,(Disk *)this);
    }
  }
  else {
    uVar12 = uVar12 - 3;
    this_00 = (Curve *)(uVar14 & 0xffffffffffff);
    if (uVar12 < 2) {
      pbrt::Triangle::Bounds(&local_300,(Triangle *)this_00);
    }
    else if (uVar12 == 2) {
      pbrt::BilinearPatch::Bounds(&local_300,(BilinearPatch *)this_00);
    }
    else {
      pbrt::Curve::Bounds(&local_300,this_00);
    }
  }
  iVar17 = 0;
  local_328[2] = 0.0;
  local_328[1] = 0.0;
  local_328[0] = 0.0;
  uVar14 = rng->state;
  uVar1 = rng->inc;
  do {
    uVar12 = (uint)(uVar14 >> 0x2d) ^ (uint)(uVar14 >> 0x1b);
    bVar16 = (byte)(uVar14 >> 0x3b);
    auVar20 = vcvtusi2ss_avx512f(auVar24,uVar12 >> bVar16 | uVar12 << 0x20 - bVar16);
    auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),
                         SUB6416(ZEXT464(0x3f7fffff),0));
    pfVar13 = (float *)((long)local_328 + 8);
    if ((iVar17 != 0) && (pfVar13 = local_328, iVar17 == 1)) {
      pfVar13 = (float *)((long)local_328 + 4);
    }
    iVar17 = iVar17 + 1;
    *pfVar13 = auVar20._0_4_;
    uVar14 = uVar14 * 0x5851f42d4c957f2d + uVar1;
  } while (iVar17 != 3);
  auVar20._8_4_ = 0x3f800000;
  auVar20._0_8_ = 0x3f8000003f800000;
  auVar20._12_4_ = 0x3f800000;
  uVar12 = (uint)(uVar14 >> 0x2d) ^ (uint)(uVar14 >> 0x1b);
  bVar16 = (byte)(uVar14 >> 0x3b);
  local_2d0.o.super_Tuple3<pbrt::Point3,_float>.x = local_314;
  local_2d0.o.super_Tuple3<pbrt::Point3,_float>.y = local_318;
  auVar24 = vinsertps_avx(ZEXT416((uint)local_328[2]),ZEXT416((uint)local_328[1]),0x10);
  auVar33 = vfmadd231ss_fma(ZEXT416((uint)(local_328[0] *
                                          local_300.pMax.super_Tuple3<pbrt::Point3,_float>.z)),
                            ZEXT416((uint)(1.0 - local_328[0])),
                            ZEXT416((uint)local_300.pMin.super_Tuple3<pbrt::Point3,_float>.z));
  auVar27._8_8_ = 0;
  auVar27._0_4_ = local_300.pMin.super_Tuple3<pbrt::Point3,_float>.x;
  auVar27._4_4_ = local_300.pMin.super_Tuple3<pbrt::Point3,_float>.y;
  auVar20 = vsubps_avx(auVar20,auVar24);
  auVar34 = ZEXT1664(auVar20);
  auVar21._0_4_ = auVar24._0_4_ * local_300.pMax.super_Tuple3<pbrt::Point3,_float>.x;
  auVar21._4_4_ = auVar24._4_4_ * local_300.pMax.super_Tuple3<pbrt::Point3,_float>.y;
  auVar21._8_4_ = auVar24._8_4_ * 0.0;
  auVar21._12_4_ = auVar24._12_4_ * 0.0;
  auVar20 = vfmadd231ps_fma(auVar21,auVar27,auVar20);
  auVar24 = vinsertps_avx(ZEXT416((uint)local_314),ZEXT416((uint)local_318),0x10);
  auVar20 = vsubps_avx(auVar20,auVar24);
  local_2d0.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar33._0_4_ - local_328[3];
  local_2d0.o.super_Tuple3<pbrt::Point3,_float>.z = local_328[3];
  auVar24 = vcvtusi2ss_avx512f(in_XMM7,uVar12 >> bVar16 | uVar12 << 0x20 - bVar16);
  local_2d0.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar20);
  local_2d0.time = 0.0;
  local_2d0.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  rng->state = uVar14 * 0x5851f42d4c957f2d + uVar1;
  auVar24 = vminss_avx(ZEXT416((uint)(auVar24._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  if (auVar24._0_4_ < 0.5) {
    auVar24._0_4_ = auVar20._0_4_ * auVar20._0_4_;
    auVar24._4_4_ = auVar20._4_4_ * auVar20._4_4_;
    auVar24._8_4_ = auVar20._8_4_ * auVar20._8_4_;
    auVar24._12_4_ = auVar20._12_4_ * auVar20._12_4_;
    auVar24 = vmovshdup_avx(auVar24);
    auVar24 = vfmadd231ss_fma(auVar24,auVar20,auVar20);
    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)local_2d0.d.super_Tuple3<pbrt::Vector3,_float>.z
                                             ),
                              ZEXT416((uint)local_2d0.d.super_Tuple3<pbrt::Vector3,_float>.z));
    auVar24 = vsqrtss_avx(auVar24,auVar24);
    fVar19 = auVar24._0_4_;
    auVar33._4_4_ = fVar19;
    auVar33._0_4_ = fVar19;
    auVar33._8_4_ = fVar19;
    auVar33._12_4_ = fVar19;
    local_2d0.d.super_Tuple3<pbrt::Vector3,_float>.z =
         local_2d0.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar19;
    auVar24 = vdivps_avx(auVar20,auVar33);
    local_2d0.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar24);
  }
  pbrt::ShapeHandle::Intersect
            ((optional<pbrt::ShapeIntersection> *)&local_248.__align,local_330,&local_2d0,INFINITY);
  iVar17 = 0;
  if (local_148 == '\x01') {
    iVar17 = 0;
    local_338 = 0;
    do {
      uVar14 = rng->state * 0x5851f42d4c957f2d + rng->inc;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = rng->state;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar14;
      auVar24 = vpunpcklqdq_avx(auVar28,auVar23);
      auVar20 = vpsrlvq_avx2(auVar24,_DAT_006015b0);
      auVar33 = vpsrlvq_avx2(auVar24,_DAT_006015a0);
      auVar24 = vpsrlq_avx(auVar24,0x3b);
      auVar24 = vpshufd_avx(auVar24,0xe8);
      rng->state = uVar14 * 0x5851f42d4c957f2d + rng->inc;
      auVar20 = vpshufd_avx(auVar33 ^ auVar20,0xe8);
      auVar24 = vprorvd_avx512vl(auVar20,auVar24);
      auVar24 = vcvtudq2ps_avx512vl(auVar24);
      auVar4._8_4_ = 0x2f800000;
      auVar4._0_8_ = 0x2f8000002f800000;
      auVar4._12_4_ = 0x2f800000;
      auVar20 = vmulps_avx512vl(auVar24,auVar4);
      auVar5._8_4_ = 0x3f7fffff;
      auVar5._0_8_ = 0x3f7fffff3f7fffff;
      auVar5._12_4_ = 0x3f7fffff;
      uVar14 = vcmpps_avx512vl(auVar20,auVar5,1);
      auVar24 = vmovshdup_avx(auVar20);
      bVar16 = (byte)(uVar14 >> 1);
      local_258 = vfmadd132ss_fma(ZEXT416((uint)(bVar16 & 1) * auVar24._0_4_ +
                                          (uint)!(bool)(bVar16 & 1) * 0x3f7fffff),
                                  SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
      auVar24 = vfnmadd213ss_fma(local_258,local_258,SUB6416(ZEXT464(0x3f800000),0));
      auVar24 = vmaxss_avx(auVar24,ZEXT816(0) << 0x40);
      local_2e8 = vsqrtss_avx(auVar24,auVar24);
      fVar19 = (float)((uint)((byte)uVar14 & 1) * (int)(auVar20._0_4_ * 6.2831855) +
                      (uint)!(bool)((byte)uVar14 & 1) * 0x40c90fda);
      local_278 = ZEXT416((uint)fVar19);
      local_268 = cosf(fVar19);
      uStack_264 = extraout_XMM0_Db;
      uStack_260 = extraout_XMM0_Dc;
      uStack_25c = extraout_XMM0_Dd;
      auVar26._0_4_ = sinf((float)local_278._0_4_);
      auVar26._4_60_ = extraout_var;
      auVar7._4_4_ = uStack_264;
      auVar7._0_4_ = local_268;
      auVar7._8_4_ = uStack_260;
      auVar7._12_4_ = uStack_25c;
      auVar24 = vinsertps_avx(auVar7,auVar26._0_16_,0x10);
      fVar19 = local_258._0_4_;
      auVar20 = vfmsub213ss_fma(ZEXT416((uint)local_248._48_4_),local_258,
                                ZEXT416((uint)(fVar19 * (float)local_248._48_4_)));
      auVar25._0_4_ = auVar24._0_4_ * (float)local_2e8._0_4_;
      auVar25._4_4_ = auVar24._4_4_ * (float)local_2e8._0_4_;
      auVar25._8_4_ = auVar24._8_4_ * (float)local_2e8._0_4_;
      auVar25._12_4_ = auVar24._12_4_ * (float)local_2e8._0_4_;
      auVar24 = vmovshdup_avx(auVar25);
      auVar24 = vfmadd132ss_fma(auVar24,ZEXT416((uint)(fVar19 * (float)local_248._48_4_)),
                                ZEXT416((uint)local_248._44_4_));
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(auVar24._0_4_ + auVar20._0_4_)),auVar25,
                                ZEXT416((uint)local_248._40_4_));
      if (auVar24._0_4_ < 0.0) {
        uVar14 = CONCAT44(auVar25._4_4_,auVar25._0_4_);
        auVar25._0_8_ = uVar14 ^ 0x8000000080000000;
        auVar25._8_4_ = -auVar25._8_4_;
        auVar25._12_4_ = -auVar25._12_4_;
      }
      uVar2 = vcmpss_avx512f(auVar24,ZEXT816(0) << 0x40,1);
      bVar11 = (bool)((byte)uVar2 & 1);
      local_310._0_8_ = vmovlps_avx(auVar25);
      local_310.z = (float)((uint)bVar11 * (int)-fVar19 + (uint)!bVar11 * (int)fVar19);
      pbrt::Interaction::SpawnRay
                ((RayDifferential *)&local_138.__align,(Interaction *)&local_248.__align,
                 (Vector3f *)&local_310);
      pSVar10 = local_330;
      local_348.x = INFINITY;
      local_2a8.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_138._20_4_;
      local_2a8.time = (Float)local_138._24_4_;
      local_2a8.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = local_138.__align;
      local_2a8.medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                 )local_138._32_8_;
      local_138.__align =
           (anon_struct_8_0_00000001_for___align)
           (local_330->
           super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
           ).bits;
      bVar11 = pbrt::detail::DispatchSplit<6>::operator()
                         ((DispatchSplit<6> *)&local_334,
                          (anon_struct_8_0_00000001_for___align *)&local_2a8,&local_348,&local_138,
                          (ulong)local_138.__align >> 0x30);
      pbrt::ShapeHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_138.__align,pSVar10,&local_2a8,INFINITY
                );
      auVar24 = local_2e8;
      local_348.x = 0.0;
      local_348.y = 0.0;
      iVar18 = 0;
      local_348.z = 0.0;
      local_2e8._1_3_ = 0;
      local_2e8[0] = local_38;
      local_2e8._4_12_ = auVar24._4_12_;
      do {
        uVar14 = rng->state;
        rng->state = uVar14 * 0x5851f42d4c957f2d + rng->inc;
        uVar12 = (uint)(uVar14 >> 0x2d) ^ (uint)(uVar14 >> 0x1b);
        bVar16 = (byte)(uVar14 >> 0x3b);
        auVar24 = vcvtusi2ss_avx512f(auVar34._0_16_,uVar12 >> bVar16 | uVar12 << 0x20 - bVar16);
        auVar24 = vminss_avx(ZEXT416((uint)(auVar24._0_4_ * 2.3283064e-10)),
                             SUB6416(ZEXT464(0x3f7fffff),0));
        auVar24 = vfmadd231ss_fma(ZEXT416((uint)(auVar24._0_4_ * 8.0)),
                                  ZEXT416((uint)(1.0 - auVar24._0_4_)),ZEXT416(0xc1000000));
        dVar22 = pow(10.0,(double)auVar24._0_4_);
        iVar9 = local_338;
        pTVar15 = &local_348;
        if ((iVar18 != 0) && (pTVar15 = (Tuple3<pbrt::Point3,_float> *)&local_348.y, iVar18 != 1)) {
          pTVar15 = (Tuple3<pbrt::Point3,_float> *)&local_348.z;
        }
        iVar18 = iVar18 + 1;
        pTVar15->x = (float)dVar22;
      } while (iVar18 != 3);
      auVar8._4_8_ = local_248._4_8_;
      auVar8._0_4_ = local_248._0_4_;
      auVar8._12_4_ = local_248._12_4_;
      auVar24 = vinsertps_avx(auVar8,ZEXT416((uint)local_248._12_4_),0x10);
      fVar19 = ((float)local_248._16_4_ + (float)local_248._20_4_) * 0.5;
      auVar29._0_4_ = (float)local_248._4_8_ + auVar24._0_4_;
      auVar29._4_4_ = (float)((ulong)local_248._4_8_ >> 0x20) + auVar24._4_4_;
      auVar29._8_4_ = auVar24._8_4_ + 0.0;
      auVar29._12_4_ = auVar24._12_4_ + 0.0;
      auVar6._8_4_ = 0x3f000000;
      auVar6._0_8_ = 0x3f0000003f000000;
      auVar6._12_4_ = 0x3f000000;
      auVar21 = vmulps_avx512vl(auVar29,auVar6);
      auVar31._8_8_ = 0;
      auVar31._0_4_ = local_348.x;
      auVar31._4_4_ = local_348.y;
      local_348.z = local_348.z - fVar19;
      auVar20 = vsubps_avx(auVar31,auVar21);
      auVar33 = vfmsub213ss_fma(ZEXT416((uint)local_248._48_4_),ZEXT416((uint)local_348.z),
                                ZEXT416((uint)(local_348.z * (float)local_248._48_4_)));
      auVar24 = vmovshdup_avx(auVar20);
      auVar24 = vfmadd132ss_fma(auVar24,ZEXT416((uint)(local_348.z * (float)local_248._48_4_)),
                                ZEXT416((uint)local_248._44_4_));
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(auVar24._0_4_ + auVar33._0_4_)),auVar20,
                                ZEXT416((uint)local_248._40_4_));
      auVar34 = ZEXT864(0) << 0x20;
      auVar32 = auVar20;
      if (auVar24._0_4_ < 0.0) {
        auVar32._0_8_ = auVar20._0_8_ ^ 0x8000000080000000;
        auVar32._8_4_ = auVar20._8_4_ ^ 0x80000000;
        auVar32._12_4_ = auVar20._12_4_ ^ 0x80000000;
      }
      uVar2 = vcmpss_avx512f(auVar24,ZEXT816(0) << 0x20,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      iVar17 = iVar17 + (uint)bVar11 + local_2e8._0_4_;
      auVar30._0_4_ = auVar21._0_4_ + auVar32._0_4_;
      auVar30._4_4_ = auVar21._4_4_ + auVar32._4_4_;
      auVar30._8_4_ = auVar21._8_4_ + auVar32._8_4_;
      auVar30._12_4_ = auVar21._12_4_ + auVar32._12_4_;
      local_310._0_8_ = vmovlps_avx(auVar32);
      local_310.z = (float)((uint)bVar3 * (int)-local_348.z + (uint)!bVar3 * (int)local_348.z);
      local_348.z = fVar19 + local_310.z;
      local_348._0_8_ = vmovlps_avx(auVar30);
      pbrt::Interaction::SpawnRayTo
                ((Ray *)&local_138.__align,(Interaction *)&local_248.__align,(Point3f *)&local_348);
      pSVar10 = local_330;
      local_334 = 0x3f800000;
      local_2a8.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_138._20_4_;
      local_2a8.time = (Float)local_138._24_4_;
      local_2a8.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = local_138.__align;
      local_2a8.medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                 )local_138._32_8_;
      local_138.__align =
           (anon_struct_8_0_00000001_for___align)
           (local_330->
           super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
           ).bits;
      bVar11 = pbrt::detail::DispatchSplit<6>::operator()
                         (&local_339,&local_2a8,&local_334,&local_138,
                          (ulong)local_138.__align >> 0x30);
      pbrt::ShapeHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_138.__align,pSVar10,&local_2a8,1.0);
      local_338 = iVar9 + 1;
      iVar17 = (uint)local_38 + iVar17 + (uint)bVar11;
    } while (local_338 != 1000);
  }
  return iVar17;
}

Assistant:

static int TestReintersectConvex(ShapeHandle shape, RNG &rng) {
    // Ray origin
    Point3f o;
    for (int c = 0; c < 3; ++c)
        o[c] = pExp(rng);

    // Destination: a random point in the shape's bounding box.
    Bounds3f bbox = shape.Bounds();
    Point3f t;
    for (int c = 0; c < 3; ++c)
        t[c] = rng.Uniform<Float>();
    Point3f p2 = bbox.Lerp(t);

    // Ray to intersect with the shape.
    Ray r(o, p2 - o);
    if (rng.Uniform<Float>() < .5)
        r.d = Normalize(r.d);

    // We should usually (but not always) find an intersection.
    auto si = shape.Intersect(r);
    if (!si)
        return 0;
    SurfaceInteraction &isect = si->intr;

    // Now trace a bunch of rays leaving the intersection point.
    int n = 0;
    for (int j = 0; j < 1000; ++j) {
        // Random direction leaving the intersection point.
        Point2f u;
        u[0] = rng.Uniform<Float>();
        u[1] = rng.Uniform<Float>();
        Vector3f w = SampleUniformSphere(u);
        // Make sure it's in the same hemisphere as the surface normal.
        w = FaceForward(w, isect.n);
        Ray rOut = isect.SpawnRay(w);

        if (shape.IntersectP(rOut))
            ++n;
        if (shape.Intersect(rOut).has_value())
            ++n;

        // Choose a random point to trace rays to.
        Point3f p2;
        for (int c = 0; c < 3; ++c)
            p2[c] = pExp(rng);
        // Make sure that the point we're tracing rays toward is in the
        // hemisphere about the intersection point's surface normal.
        w = p2 - isect.p();
        w = FaceForward(w, isect.n);
        p2 = isect.p() + w;
        rOut = isect.SpawnRayTo(p2);

        if (shape.IntersectP(rOut, 1))
            ++n;
        if (shape.Intersect(rOut, 1).has_value())
            ++n;
    }

    return n;
}